

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UnicodeString *text,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  short sVar1;
  uint uVar2;
  char16_t *pcVar3;
  uint c;
  uint uVar4;
  ulong uVar5;
  
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar4 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)uVar2 >> 5;
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      c = 0xffff;
      if (uVar5 < uVar4) {
        pcVar3 = (char16_t *)((long)&text->fUnion + 2);
        if ((uVar2 & 2) == 0) {
          pcVar3 = (text->fUnion).fFields.fArray;
        }
        c = (uint)(ushort)pcVar3[uVar5];
      }
      appendToRule(rule,c,isLiteral,escapeUnprintable,quoteBuf);
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      uVar2 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar4 = (text->fUnion).fFields.fLength;
      }
      else {
        uVar4 = (int)uVar2 >> 5;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)(int)uVar4);
  }
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               const UnicodeString& text,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    for (int32_t i=0; i<text.length(); ++i) {
        appendToRule(rule, text[i], isLiteral, escapeUnprintable, quoteBuf);
    }
}